

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_bbdpre.c
# Opt level: O0

int IDABBDPrecInitB(void *ida_mem,int which,sunindextype NlocalB,sunindextype mudqB,
                   sunindextype mldqB,sunindextype mukeepB,sunindextype mlkeepB,
                   sunrealtype dq_rel_yyB,IDABBDLocalFnB glocalB,IDABBDCommFnB gcommB)

{
  undefined8 *puVar1;
  int in_ESI;
  IDAMem in_RDI;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  int flag;
  void *ida_memB;
  IDABBDPrecDataB idabbdB_mem;
  IDABMem IDAB_mem;
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  undefined4 in_stack_00000070;
  sunindextype in_stack_00000080;
  sunindextype in_stack_00000088;
  IDABBDLocalFn in_stack_000000b0;
  IDABBDCommFn in_stack_000000b8;
  code *pcVar2;
  code *pcVar3;
  IDABMemRec *local_58;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-1,0x2eb,"IDABBDPrecInitB",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_bbdpre.c"
                    ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->ida_adjMallocDone == 0) {
    IDAProcessError(in_RDI,-0x65,0x2f4,"IDABBDPrecInitB",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_bbdpre.c"
                    ,"Illegal attempt to call before calling IDAAdjInit.");
    local_4 = -0x65;
  }
  else if (in_ESI < in_RDI->ida_adj_mem->ia_nbckpbs) {
    for (local_58 = in_RDI->ida_adj_mem->IDAB_mem;
        (local_58 != (IDABMemRec *)0x0 && (in_ESI != local_58->ida_index));
        local_58 = local_58->ida_next) {
    }
    pcVar2 = IDAAglocal;
    pcVar3 = IDAAgcomm;
    local_4 = IDABBDPrecInit(glocalB,mlkeepB,in_stack_00000088,in_stack_00000080,
                             (sunindextype)ida_mem,CONCAT44(which,in_stack_00000070),
                             (sunrealtype)NlocalB,in_stack_000000b0,in_stack_000000b8);
    if (local_4 == 0) {
      puVar1 = (undefined8 *)malloc(0x10);
      if (puVar1 == (undefined8 *)0x0) {
        IDAProcessError(in_RDI,-4,0x318,"IDABBDPrecInitB",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_bbdpre.c"
                        ,"A memory request failed.",pcVar2,pcVar3);
        local_4 = -4;
      }
      else {
        *puVar1 = in_stack_00000010;
        puVar1[1] = in_stack_00000018;
        local_58->ida_pmem = puVar1;
        local_58->ida_pfree = IDABBDPrecFreeB;
        local_4 = 0;
      }
    }
  }
  else {
    IDAProcessError(in_RDI,-3,0x2fd,"IDABBDPrecInitB",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_bbdpre.c"
                    ,"Illegal value for which.");
    local_4 = -3;
  }
  return local_4;
}

Assistant:

int IDABBDPrecInitB(void* ida_mem, int which, sunindextype NlocalB,
                    sunindextype mudqB, sunindextype mldqB, sunindextype mukeepB,
                    sunindextype mlkeepB, sunrealtype dq_rel_yyB,
                    IDABBDLocalFnB glocalB, IDABBDCommFnB gcommB)
{
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  IDABMem IDAB_mem;
  IDABBDPrecDataB idabbdB_mem;
  void* ida_memB;
  int flag;

  /* Check if ida_mem is all right. */
  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDALS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_IDAMEM_NULL);
    return (IDALS_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Is ASA initialized? */
  if (IDA_mem->ida_adjMallocDone == SUNFALSE)
  {
    IDAProcessError(IDA_mem, IDALS_NO_ADJ, __LINE__, __func__, __FILE__,
                    MSG_LS_NO_ADJ);
    return (IDALS_NO_ADJ);
  }
  IDAADJ_mem = IDA_mem->ida_adj_mem;

  /* Check the value of which */
  if (which >= IDAADJ_mem->ia_nbckpbs)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_WHICH);
    return (IDALS_ILL_INPUT);
  }

  /* Find the IDABMem entry in the linked list corresponding to 'which'. */
  IDAB_mem = IDAADJ_mem->IDAB_mem;
  while (IDAB_mem != NULL)
  {
    if (which == IDAB_mem->ida_index) { break; }
    /* advance */
    IDAB_mem = IDAB_mem->ida_next;
  }
  /* ida_mem corresponding to 'which' problem. */
  ida_memB = (void*)IDAB_mem->IDA_mem;

  /* Initialize the BBD preconditioner for this backward problem. */
  flag = IDABBDPrecInit(ida_memB, NlocalB, mudqB, mldqB, mukeepB, mlkeepB,
                        dq_rel_yyB, IDAAglocal, IDAAgcomm);
  if (flag != IDA_SUCCESS) { return (flag); }

  /* Allocate memory for IDABBDPrecDataB to store the user-provided
     functions which will be called from the wrappers */
  idabbdB_mem = NULL;
  idabbdB_mem = (IDABBDPrecDataB)malloc(sizeof(*idabbdB_mem));
  if (idabbdB_mem == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSGBBD_MEM_FAIL);
    return (IDALS_MEM_FAIL);
  }

  /* set pointers to user-provided functions */
  idabbdB_mem->glocalB = glocalB;
  idabbdB_mem->gcommB  = gcommB;

  /* Attach pmem and pfree */
  IDAB_mem->ida_pmem  = idabbdB_mem;
  IDAB_mem->ida_pfree = IDABBDPrecFreeB;

  return (IDALS_SUCCESS);
}